

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

Gia_Man_t * Kf_ManDerive(Kf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int Entry;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *pCut;
  int Fill;
  int v;
  
  pJVar1 = p->pPars;
  if (pJVar1->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x4f4,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  p_00 = Vec_IntAlloc(p->pGia->nObjs + (int)pJVar1->Edge + (int)pJVar1->Area * 2);
  Vec_IntFill(p_00,p->pGia->nObjs,Fill);
  for (v = 0; v < p->pGia->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar3 = Gia_ObjIsBuf(pObj);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjRefNum(p->pGia,pObj);
        if (iVar3 != 0) {
          pCut = Kf_ObjCutBest(p,v);
          Vec_IntWriteEntry(p_00,v,p_00->nSize);
          Vec_IntPush(p_00,*pCut);
          for (iVar3 = 1; iVar3 <= *pCut; iVar3 = iVar3 + 1) {
            Entry = Kf_CutLeaf(pCut,iVar3);
            Vec_IntPush(p_00,Entry);
          }
          Vec_IntPush(p_00,v);
        }
      }
    }
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x502,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  pGVar2 = p->pGia;
  pGVar2->vMapping = p_00;
  return pGVar2;
}

Assistant:

Gia_Man_t * Kf_ManDerive( Kf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Kf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Kf_CutSize(pCut) );
        for ( k = 1; k <= Kf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Kf_CutLeaf(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
    return p->pGia;
}